

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream_serializer.h
# Opt level: O2

ssize_t __thiscall
crnlib::data_stream_serializer::read
          (data_stream_serializer *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = (int)__nbytes * (int)__buf;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = __nbytes & 0xffffffff;
    uVar1 = (*this->m_pStream->_vptr_data_stream[4])(this->m_pStream,__fd,(ulong)uVar3);
    if (uVar1 != uVar3) {
      uVar2 = (ulong)uVar1 / ((ulong)__buf & 0xffffffff);
    }
  }
  return uVar2;
}

Assistant:

uint read(void* pBuf, uint size, uint count)
        {
            uint actual_size = size * count;
            if (!actual_size)
            {
                return 0;
            }
            uint n = m_pStream->read(pBuf, actual_size);
            if (n == actual_size)
            {
                return count;
            }
            return n / size;
        }